

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

void jp2_destroy(opj_jp2_v2_t *jp2)

{
  undefined8 *in_RDI;
  
  if (in_RDI != (undefined8 *)0x0) {
    j2k_destroy((opj_j2k_v2_t *)0x2be23c);
    *in_RDI = 0;
    if (in_RDI[0xb] != 0) {
      free((void *)in_RDI[0xb]);
      in_RDI[0xb] = 0;
    }
    if (in_RDI[10] != 0) {
      free((void *)in_RDI[10]);
      in_RDI[10] = 0;
    }
    if (in_RDI[0xe] != 0) {
      free((void *)in_RDI[0xe]);
      in_RDI[0xe] = 0;
    }
    if (in_RDI[0x10] != 0) {
      if (*(long *)in_RDI[0x10] != 0) {
        free(*(void **)in_RDI[0x10]);
        *(undefined8 *)in_RDI[0x10] = 0;
      }
      free((void *)in_RDI[0x10]);
      in_RDI[0x10] = 0;
    }
    if (in_RDI[0x11] != 0) {
      if (*(long *)(in_RDI[0x11] + 0x18) != 0) {
        free(*(void **)(in_RDI[0x11] + 0x18));
        *(undefined8 *)(in_RDI[0x11] + 0x18) = 0;
      }
      if (*(long *)(in_RDI[0x11] + 8) != 0) {
        free(*(void **)(in_RDI[0x11] + 8));
        *(undefined8 *)(in_RDI[0x11] + 8) = 0;
      }
      if (*(long *)(in_RDI[0x11] + 0x10) != 0) {
        free(*(void **)(in_RDI[0x11] + 0x10));
        *(undefined8 *)(in_RDI[0x11] + 0x10) = 0;
      }
      if (*(long *)in_RDI[0x11] != 0) {
        free(*(void **)in_RDI[0x11]);
        *(undefined8 *)in_RDI[0x11] = 0;
      }
      free((void *)in_RDI[0x11]);
      in_RDI[0x11] = 0;
    }
    if (in_RDI[1] != 0) {
      opj_procedure_list_destroy((opj_procedure_list_t *)0x2be440);
      in_RDI[1] = 0;
    }
    if (in_RDI[2] != 0) {
      opj_procedure_list_destroy((opj_procedure_list_t *)0x2be464);
      in_RDI[2] = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void jp2_destroy(opj_jp2_v2_t *jp2)
{
	if (jp2) {
		/* destroy the J2K codec */
		j2k_destroy(jp2->j2k);
		jp2->j2k = 00;

		if (jp2->comps) {
			opj_free(jp2->comps);
			jp2->comps = 00;
		}

		if (jp2->cl) {
			opj_free(jp2->cl);
			jp2->cl = 00;
		}

		if (jp2->color.icc_profile_buf) {
			opj_free(jp2->color.icc_profile_buf);
			jp2->color.icc_profile_buf = 00;
		}

		if (jp2->color.jp2_cdef) {
			if (jp2->color.jp2_cdef->info) {
				opj_free(jp2->color.jp2_cdef->info);
				jp2->color.jp2_cdef->info = NULL;
			}

			opj_free(jp2->color.jp2_cdef);
			jp2->color.jp2_cdef = 00;
		}

		if (jp2->color.jp2_pclr) {
			if (jp2->color.jp2_pclr->cmap) {
				opj_free(jp2->color.jp2_pclr->cmap);
				jp2->color.jp2_pclr->cmap = NULL;
			}
			if (jp2->color.jp2_pclr->channel_sign) {
				opj_free(jp2->color.jp2_pclr->channel_sign);
				jp2->color.jp2_pclr->channel_sign = NULL;
			}
			if (jp2->color.jp2_pclr->channel_size) {
				opj_free(jp2->color.jp2_pclr->channel_size);
				jp2->color.jp2_pclr->channel_size = NULL;
			}
			if (jp2->color.jp2_pclr->entries) {
				opj_free(jp2->color.jp2_pclr->entries);
				jp2->color.jp2_pclr->entries = NULL;
			}

			opj_free(jp2->color.jp2_pclr);
			jp2->color.jp2_pclr = 00;
		}

		if (jp2->m_validation_list) {
			opj_procedure_list_destroy(jp2->m_validation_list);
			jp2->m_validation_list = 00;
		}

		if (jp2->m_procedure_list) {
			opj_procedure_list_destroy(jp2->m_procedure_list);
			jp2->m_procedure_list = 00;
		}

		opj_free(jp2);
	}
}